

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wavelets_smart.cpp
# Opt level: O3

void calcola_wavelet_minus(vector<double,_std::allocator<double>_> *v,string *stringa)

{
  pointer pdVar1;
  pointer pdVar2;
  ostream *poVar3;
  long lVar4;
  ulong uVar5;
  int iVar6;
  vector<double,_std::allocator<double>_> first;
  ofstream ofi;
  ostringstream ostring3;
  ostringstream ostring;
  vector<double,_std::allocator<double>_> local_578;
  vector<double,_std::allocator<double>_> local_558;
  undefined1 *local_540 [2];
  undefined1 local_530 [16];
  double local_520;
  filebuf local_518 [240];
  ios_base local_428 [264];
  ostringstream local_320 [112];
  ios_base local_2b0 [264];
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"wavelet_",8);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1a8,(stringa->_M_dataplus)._M_p,stringa->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,".txt",4);
  pdVar1 = (v->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
  pdVar2 = (v->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::clear(&v_coeff_w_plus);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::clear(&v_coeff_w_minus);
  if (variance_plus.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      variance_plus.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start) {
    variance_plus.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish =
         variance_plus.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_start;
  }
  if (variance_minus.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      variance_minus.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start) {
    variance_minus.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish =
         variance_minus.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_start;
  }
  local_578.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_578.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (double *)0x0;
  local_578.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (double *)0x0;
  iVar6 = (int)((ulong)((long)pdVar1 - (long)pdVar2) >> 3);
  if (-1 < iVar6) {
    lVar4 = 0;
    do {
      pdVar1 = (v->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      local_520 = (pdVar1[lVar4] + pdVar1[lVar4 + 1]) * 0.5;
      if (local_578.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_578.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                  ((vector<double,std::allocator<double>> *)&local_578,
                   (iterator)
                   local_578.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_finish,&local_520);
      }
      else {
        *local_578.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_finish = local_520;
        local_578.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_578.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish + 1;
      }
      lVar4 = lVar4 + 2;
    } while ((int)lVar4 <= iVar6);
  }
  std::vector<double,_std::allocator<double>_>::vector(&local_558,&local_578);
  wavelet_pass_minus(&local_558);
  if (local_558.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_558.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (v_coeff_w_plus.
      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      v_coeff_w_plus.
      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    lVar4 = 0;
    uVar5 = 0;
    do {
      local_520 = varianza<double>((vector<double,_std::allocator<double>_> *)
                                   ((long)&((v_coeff_w_plus.
                                             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start)->
                                           super__Vector_base<double,_std::allocator<double>_>).
                                           _M_impl.super__Vector_impl_data._M_start + lVar4));
      if (variance_plus.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          variance_plus.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                  (&variance_plus,
                   (iterator)
                   variance_plus.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_finish,&local_520);
      }
      else {
        *variance_plus.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_finish = local_520;
        variance_plus.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish =
             variance_plus.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish + 1;
      }
      uVar5 = uVar5 + 1;
      lVar4 = lVar4 + 0x18;
    } while (uVar5 < (ulong)(((long)v_coeff_w_plus.
                                    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)v_coeff_w_plus.
                                    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 3) *
                            -0x5555555555555555));
  }
  if (v_coeff_w_minus.
      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      v_coeff_w_minus.
      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    lVar4 = 0;
    uVar5 = 0;
    do {
      local_520 = varianza<double>((vector<double,_std::allocator<double>_> *)
                                   ((long)&((v_coeff_w_minus.
                                             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start)->
                                           super__Vector_base<double,_std::allocator<double>_>).
                                           _M_impl.super__Vector_impl_data._M_start + lVar4));
      if (variance_minus.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          variance_minus.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                  (&variance_minus,
                   (iterator)
                   variance_minus.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_finish,&local_520);
      }
      else {
        *variance_minus.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_finish = local_520;
        variance_minus.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish =
             variance_minus.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish + 1;
      }
      uVar5 = uVar5 + 1;
      lVar4 = lVar4 + 0x18;
    } while (uVar5 < (ulong)(((long)v_coeff_w_minus.
                                    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)v_coeff_w_minus.
                                    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 3) *
                            -0x5555555555555555));
  }
  std::__cxx11::ostringstream::ostringstream(local_320);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,"wavelet_",8);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_320,(stringa->_M_dataplus)._M_p,stringa->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"coeff.txt",9);
  std::__cxx11::stringbuf::str();
  std::ofstream::ofstream(&local_520,(string *)local_540,_S_out);
  if (local_540[0] != local_530) {
    operator_delete(local_540[0]);
  }
  if (variance_plus.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      variance_plus.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start) {
    uVar5 = 0;
    do {
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&local_520);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\t",1);
      poVar3 = std::ostream::_M_insert<double>
                         (variance_plus.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start[uVar5]);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\t",1);
      poVar3 = std::ostream::_M_insert<double>
                         (variance_minus.super__Vector_base<double,_std::allocator<double>_>._M_impl
                          .super__Vector_impl_data._M_start[uVar5]);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
      std::ostream::put((char)poVar3);
      std::ostream::flush();
      uVar5 = uVar5 + 1;
    } while (uVar5 < (ulong)((long)variance_plus.super__Vector_base<double,_std::allocator<double>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)variance_plus.super__Vector_base<double,_std::allocator<double>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 3));
  }
  std::ofstream::close();
  local_520 = _VTT;
  *(undefined8 *)(local_518 + *(long *)((long)_VTT + -0x18) + -8) = __filebuf;
  std::filebuf::~filebuf(local_518);
  std::ios_base::~ios_base(local_428);
  std::__cxx11::ostringstream::~ostringstream(local_320);
  std::ios_base::~ios_base(local_2b0);
  if (local_578.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_578.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  std::ios_base::~ios_base(local_138);
  return;
}

Assistant:

void calcola_wavelet_minus(vector<double> v, string stringa) {
	ostringstream ostring;
	ostring << "wavelet_" << stringa << ".txt";
	int size = v.size(); 

	v_coeff_w_plus.clear();
	v_coeff_w_minus.clear();
	variance_plus.clear();
	variance_minus.clear();

	vector<double> first;
	for(int i = 0; i < size + 1; i += 2) {
		double m = (v[i] + v[i + 1]) / 2.;
		first.push_back(m);
	};

	wavelet_pass_minus(first);


	for(size_t i = 0; i < v_coeff_w_plus.size(); i++)variance_plus.push_back(varianza(v_coeff_w_plus[i]));

	for(size_t i = 0; i < v_coeff_w_minus.size(); i++)variance_minus.push_back(varianza(v_coeff_w_minus[i]));
	
	//ofstream ofi_coeff_p("coeff_plus.txt");

	//for(int i = 0; i < v_coeff_w_plus.size(); i++) {
	//	for(int j = 0; j < v_coeff_w_plus[i].size(); j++)ofi_coeff_p << v_coeff_w_plus[i][j] << " ";
	//	ofi_coeff_p << endl;
	//}

	ostringstream ostring3;
	ostring3 << "wavelet_" << stringa << "coeff.txt";
	ofstream ofi(ostring3.str());
	for(size_t i = 0; i < variance_plus.size(); i++)ofi << v_coeff_w_plus[i].size() << "\t" << variance_plus[i] << "\t" << variance_minus[i] << endl;
	ofi.close();

}